

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

ScriptPubKeyMan * __thiscall
wallet::CWallet::AddWalletDescriptor
          (CWallet *this,WalletDescriptor *desc,FlatSigningProvider *signing_provider,string *label,
          bool internal)

{
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar2;
  int iVar3;
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var4;
  char *fmt;
  undefined3 in_register_00000081;
  undefined4 uVar5;
  long in_FS_OFFSET;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
  script_pub_keys;
  uint256 id;
  undefined4 in_stack_fffffffffffffee8;
  char cVar6;
  WalletDescriptor *pWVar7;
  uint64_t in_stack_ffffffffffffff00;
  __node_base local_e0;
  size_type local_d8;
  DescriptorScriptPubKeyMan *local_b8;
  _Storage<wallet::AddressPurpose,_true> local_b0;
  undefined1 local_ac;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_a8;
  undefined1 local_60;
  string local_58 [32];
  long local_38;
  
  uVar5 = CONCAT31(in_register_00000081,internal);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
    fmt = "Cannot add WalletDescriptor to a non-descriptor wallet\n";
LAB_009ac0c2:
    WalletLogPrintf<>(this,fmt);
  }
  else {
    this_00 = GetDescriptorScriptPubKeyMan(this,desc);
    pWVar7 = desc;
    if (this_00 == (DescriptorScriptPubKeyMan *)0x0) {
      this_00 = (DescriptorScriptPubKeyMan *)operator_new(0x278);
      DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
                (this_00,&this->super_WalletStorage,desc,this->m_keypool_size);
      (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_a8,this_00);
      local_b8 = this_00;
      AddScriptPubKeyMan(this,(uint256 *)&local_a8._M_first,
                         (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                          )&local_b8);
      if (local_b8 != (DescriptorScriptPubKeyMan *)0x0) {
        (*(local_b8->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
      }
      local_b8 = (DescriptorScriptPubKeyMan *)0x0;
    }
    else {
      peVar1 = (desc->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar1->_vptr_Descriptor[4])(local_58,peVar1,0);
      parameters._M_dataplus._M_p._4_4_ = uVar5;
      parameters._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffee8;
      parameters._M_string_length = (size_type)pWVar7;
      parameters.field_2._M_allocated_capacity = (size_type)label;
      parameters.field_2._8_8_ = in_stack_ffffffffffffff00;
      WalletLogPrintf<std::__cxx11::string>(this,"Update existing descriptor: %s\n",parameters);
      std::__cxx11::string::~string(local_58);
      DescriptorScriptPubKeyMan::UpdateWalletDescriptor(this_00,desc);
    }
    for (p_Var4 = (signing_provider->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cVar6 = (char)uVar5,
        (_Rb_tree_header *)p_Var4 != &(signing_provider->keys)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
      CKey::GetPubKey((CPubKey *)&local_a8._M_first,(CKey *)&p_Var4[1]._M_right);
      DescriptorScriptPubKeyMan::AddDescriptorKey
                (this_00,(CKey *)&p_Var4[1]._M_right,(CPubKey *)&local_a8._M_first);
    }
    iVar3 = (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[9])(this_00,0);
    if ((char)iVar3 == '\0') {
      fmt = "Could not top up scriptPubKeys\n";
      goto LAB_009ac0c2;
    }
    iVar3 = (*((pWVar7->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Descriptor[2])();
    if ((char)iVar3 != '\0') {
LAB_009ac0ec:
      DescriptorScriptPubKeyMan::WriteDescriptor(this_00);
      goto LAB_009ac0f4;
    }
    (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1b])
              (&stack0xffffffffffffff00,this_00);
    if (local_d8 == 0) {
      WalletLogPrintf<>(this,"Could not generate scriptPubKeys (cache is empty)\n");
    }
    else if (cVar6 == '\0') {
      for (; local_e0._M_nxt != (_Hash_node_base *)0x0; local_e0._M_nxt = (local_e0._M_nxt)->_M_nxt)
      {
        local_a8._16_8_ = 0;
        local_a8._24_8_ = 0;
        local_a8._0_8_ = 0;
        local_a8._8_8_ = 0;
        local_60 = 0;
        bVar2 = ExtractDestination((CScript *)(local_e0._M_nxt + 1),
                                   (CTxDestination *)&local_a8._M_first);
        if (bVar2) {
          local_b0._M_value = RECEIVE;
          local_ac = 1;
          SetAddressBook(this,(CTxDestination *)&local_a8._M_first,label,
                         (optional<wallet::AddressPurpose> *)&local_b0);
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_a8._M_first);
      }
    }
    std::
    _Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&stack0xffffffffffffff00);
    if (local_d8 != 0) goto LAB_009ac0ec;
  }
  this_00 = (DescriptorScriptPubKeyMan *)0x0;
LAB_009ac0f4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return &this_00->super_ScriptPubKeyMan;
  }
  __stack_chk_fail();
}

Assistant:

ScriptPubKeyMan* CWallet::AddWalletDescriptor(WalletDescriptor& desc, const FlatSigningProvider& signing_provider, const std::string& label, bool internal)
{
    AssertLockHeld(cs_wallet);

    if (!IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        WalletLogPrintf("Cannot add WalletDescriptor to a non-descriptor wallet\n");
        return nullptr;
    }

    auto spk_man = GetDescriptorScriptPubKeyMan(desc);
    if (spk_man) {
        WalletLogPrintf("Update existing descriptor: %s\n", desc.descriptor->ToString());
        spk_man->UpdateWalletDescriptor(desc);
    } else {
        auto new_spk_man = std::unique_ptr<DescriptorScriptPubKeyMan>(new DescriptorScriptPubKeyMan(*this, desc, m_keypool_size));
        spk_man = new_spk_man.get();

        // Save the descriptor to memory
        uint256 id = new_spk_man->GetID();
        AddScriptPubKeyMan(id, std::move(new_spk_man));
    }

    // Add the private keys to the descriptor
    for (const auto& entry : signing_provider.keys) {
        const CKey& key = entry.second;
        spk_man->AddDescriptorKey(key, key.GetPubKey());
    }

    // Top up key pool, the manager will generate new scriptPubKeys internally
    if (!spk_man->TopUp()) {
        WalletLogPrintf("Could not top up scriptPubKeys\n");
        return nullptr;
    }

    // Apply the label if necessary
    // Note: we disable labels for ranged descriptors
    if (!desc.descriptor->IsRange()) {
        auto script_pub_keys = spk_man->GetScriptPubKeys();
        if (script_pub_keys.empty()) {
            WalletLogPrintf("Could not generate scriptPubKeys (cache is empty)\n");
            return nullptr;
        }

        if (!internal) {
            for (const auto& script : script_pub_keys) {
                CTxDestination dest;
                if (ExtractDestination(script, dest)) {
                    SetAddressBook(dest, label, AddressPurpose::RECEIVE);
                }
            }
        }
    }

    // Save the descriptor to DB
    spk_man->WriteDescriptor();

    return spk_man;
}